

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::FragmentOutputCase::iterate(FragmentOutputCase *this)

{
  allocator<float> *this_00;
  allocator<unsigned_int> *this_01;
  allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData> *this_02;
  value_type vVar1;
  Precision PVar2;
  ChannelType CVar3;
  code *pcVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  BVec4 BVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int gridWidth_00;
  int iVar15;
  int gridHeight_00;
  int width;
  int height;
  TextureChannelClass TVar16;
  value_type vVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  deUint32 dVar21;
  deBool dVar22;
  deInt32 dVar23;
  TestLog *this_03;
  RenderContext *pRVar24;
  undefined4 extraout_var;
  size_type sVar25;
  reference pvVar26;
  reference pvVar27;
  reference pvVar28;
  reference pvVar29;
  reference pvVar30;
  reference pvVar31;
  reference pvVar32;
  float *pfVar33;
  TestLog *pTVar34;
  MessageBuilder *pMVar35;
  value_type *pvVar36;
  uint *puVar37;
  undefined8 uVar38;
  TestError *pTVar39;
  TransferFormat TVar40;
  reference pvVar41;
  reference pvVar42;
  reference data;
  reference pvVar43;
  char *pcVar44;
  char *pcVar45;
  Vector<long,_4> *a;
  float fVar46;
  int local_16ec;
  int local_15d4;
  undefined4 local_15d0;
  undefined4 local_15cc;
  int local_14a8;
  Vector<unsigned_int,_4> local_13c8;
  Vector<unsigned_int,_4> local_13b8;
  undefined1 local_13a8 [8];
  UVec4 threshold_1;
  undefined1 local_1388 [8];
  Vec4 threshold;
  Vector<int,_4> local_1368;
  tcu local_1358 [16];
  Vector<float,_4> local_1348;
  undefined1 local_1338 [8];
  Vec4 baseThreshold;
  Vector<int,_4> local_1318;
  undefined1 local_1308 [8];
  IVec4 bits;
  Vector<unsigned_int,_4> local_12e8;
  Vector<unsigned_int,_4> local_12d8;
  tcu local_12c8 [8];
  uint auStack_12c0 [2];
  Vector<unsigned_int,_4> local_12b8;
  Vector<unsigned_int,_4> local_12a8;
  Vector<unsigned_int,_4> local_1298;
  undefined1 auStack_1288 [8];
  UVec4 finalThreshold;
  undefined1 local_1270 [8];
  UVec4 formatThreshold;
  deUint32 outTypeThreshold;
  deUint32 interpThreshold;
  string local_10d8;
  allocator<char> local_10b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b0;
  undefined1 local_1090 [8];
  string desc;
  allocator<char> local_1049;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1048;
  undefined1 local_1028 [8];
  string name_1;
  undefined1 local_1000 [3];
  bool isOk;
  TextureChannelClass texClass;
  ConstPixelBufferAccess reference;
  ConstPixelBufferAccess rendered_1;
  TextureFormat *format;
  Vector<bool,_4> local_fa0;
  Precision outPrecision;
  BVec4 cmpMask;
  int numValidChannels_1;
  int attachmentH_2;
  int attachmentW_2;
  int attachNdx;
  bool allLevelsOk;
  PixelBufferAccess viewportBuf;
  PixelBufferAccess buf;
  int bufH;
  int bufW;
  void *inputData;
  int local_f20;
  int location;
  int vecNdx_2;
  int numVecs_2;
  int scalarSize_1;
  bool isUint_2;
  bool isInt_2;
  bool isFloat_2;
  bool isArray_1;
  FragmentOutput *output_2;
  int outputNdx_2;
  int curInNdx;
  PixelBufferAccess rendered;
  int numValidChannels;
  int attachmentH_1;
  int attachmentW_1;
  void *dst_3;
  deUint32 dStack_eb4;
  TransferFormat transferFmt;
  int ndx_4;
  int posLoc;
  int local_d28;
  byte local_d21;
  int loc;
  byte local_cfb;
  byte local_cfa;
  allocator<char> local_cf9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  string local_cb8;
  allocator<char> local_c91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  undefined1 local_c50 [8];
  string name;
  int vecNdx_1;
  int numVecs_1;
  deUint32 glScalarType;
  int scalarSize;
  bool isUint_1;
  bool isInt_1;
  bool isFloat_1;
  bool isArray;
  FragmentOutput *output_1;
  int local_c08;
  int outputNdx_1;
  int curInVec_1;
  int ndx_3;
  deUint32 *v_2;
  Vector<unsigned_int,_4> local_be8;
  Vector<unsigned_int,_4> local_bd8;
  undefined1 local_bc8 [8];
  UVec4 c_2;
  int iy_1;
  int ix_1;
  int x_3;
  int y_3;
  deUint32 *dst_2;
  undefined1 local_b90 [8];
  UVec4 step_1;
  Vector<int,_4> local_b70;
  Functional local_b60 [8];
  IVec4 rangeDiv_1;
  string local_b40;
  MessageBuilder local_b20;
  tcu local_9a0 [8];
  uint local_998 [2];
  Vector<unsigned_long,_4> local_990;
  Vector<unsigned_long,_4> local_970;
  Vector<unsigned_long,_4> local_950;
  Vector<unsigned_long,_4> local_930;
  undefined1 local_90c [8];
  UVec4 fmtMaxVal_1;
  IVec4 fmtBits_1;
  UVec4 maxVal_2;
  UVec2 range_2;
  int ndx_2;
  deInt32 *v_1;
  Vector<int,_4> local_8b8;
  Vector<int,_4> local_8a8;
  undefined1 local_898 [8];
  IVec4 c_1;
  int iy;
  int ix;
  int x_2;
  int y_2;
  deInt32 *dst_1;
  Vector<long,_4> local_850;
  Vector<long,_4> local_830;
  Vector<long,_4> local_810;
  Vector<long,_4> local_7f0;
  undefined1 local_7d0 [8];
  IVec4 step;
  Vector<int,_4> local_7b0;
  undefined1 local_7a0 [8];
  IVec4 rangeDiv;
  MessageBuilder local_770;
  Vector<int,_4> local_5f0;
  tcu local_5e0 [8];
  int local_5d8 [2];
  Vector<int,_4> local_5d0;
  tcu local_5c0 [16];
  Vector<int,_4> local_5b0;
  Vector<long,_4> local_5a0;
  Vector<long,_4> local_580;
  Vector<long,_4> local_560;
  Vector<long,_4> local_540;
  undefined1 local_520 [8];
  IVec4 fmtMaxVal;
  Vector<long,_4> local_500;
  Vector<long,_4> local_4e0;
  Vector<long,_4> local_4c0;
  Vector<long,_4> local_4a0;
  undefined1 local_47c [8];
  IVec4 fmtMinVal;
  Vector<bool,_4> local_45c;
  undefined1 local_458 [4];
  BVec4 isZero;
  IVec4 fmtBits;
  IVec4 maxVal_1;
  IVec4 minVal_1;
  Vector<int,_2> local_41c;
  IVec2 range_1;
  int ndx_1;
  float *v;
  Vector<float,_4> local_3f8;
  undefined1 local_3e8 [8];
  Vec4 c;
  undefined1 local_3c8 [8];
  Vec4 f;
  float f1;
  float f0;
  float yf_1;
  float xf_1;
  int x_1;
  int y_1;
  MessageBuilder local_380;
  float *local_200;
  float local_1f8 [2];
  tcu local_1f0 [8];
  float afStack_1e8 [2];
  undefined1 local_1e0 [8];
  TextureFormatInfo fmtInfo;
  float *dst;
  Vec4 maxVal;
  Vec4 minVal;
  Vec2 range;
  int vecNdx;
  int numScalars;
  int numVecs;
  bool isUint;
  bool isInt;
  bool isFloat;
  FragmentOutput *output;
  int local_150;
  int outputNdx;
  int curInVec;
  float yf;
  float xf;
  int x;
  int y;
  int quadX;
  int quadY;
  int quadNdx;
  int attachmentH;
  int attachmentW;
  TextureFormat readFmt;
  TextureFormat refFmt;
  ChannelOrder CStack_110;
  bool isFixedPoint;
  TextureChannelClass chnClass;
  TextureFormat texFmt;
  int ndx;
  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  attachments;
  undefined1 local_e0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> drawBuffers;
  int numAttachments;
  int viewportH;
  int viewportW;
  int readAlignment;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  undefined1 local_90 [8];
  vector<float,_std::allocator<float>_> positions;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_61;
  undefined1 local_60 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  inputs;
  int numInputVecs;
  int numIndices;
  int numQuads;
  int numVertices;
  int gridHeight;
  int gridWidth;
  IVec2 minBufSize;
  int minCellSize;
  Functions *gl;
  TestLog *log;
  FragmentOutputCase *this_local;
  
  this_03 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar24 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar13 = (*pRVar24->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar13);
  minBufSize.m_data[0] = 8;
  getMinSize((Functional *)&gridHeight,&this->m_fboSpec);
  iVar13 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&gridHeight);
  if (iVar13 < 0) {
    iVar13 = iVar13 + 7;
  }
  iVar14 = de::clamp<int>(iVar13 >> 3,1,0xff);
  gridWidth_00 = iVar14 + 1;
  iVar13 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&gridHeight);
  if (iVar13 < 0) {
    iVar13 = iVar13 + 7;
  }
  iVar15 = de::clamp<int>(iVar13 >> 3,1,0xff);
  gridHeight_00 = iVar15 + 1;
  iVar13 = iVar14 * iVar15 * 6;
  inputs.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = getNumInputVectors(&this->m_outputs);
  sVar25 = (size_type)
           inputs.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_61);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_60,sVar25,&local_61);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_61);
  this_00 = (allocator<float> *)
            ((long)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(this_00);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_90,
             (long)(gridWidth_00 * gridHeight_00 * 4),this_00);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)((long)&viewportW + 3));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment,(long)iVar13,
             (allocator<unsigned_short> *)((long)&viewportW + 3));
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)((long)&viewportW + 3));
  width = tcu::Vector<int,_2>::x((Vector<int,_2> *)&gridHeight);
  height = tcu::Vector<int,_2>::y((Vector<int,_2> *)&gridHeight);
  sVar25 = std::
           vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
           ::size(&this->m_fboSpec);
  drawBuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar25;
  sVar25 = (size_type)
           drawBuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
  this_01 = (allocator<unsigned_int> *)
            ((long)&attachments.
                    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_01);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0,sVar25,this_01);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&attachments.
                     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar25 = (size_type)
           drawBuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
  this_02 = (allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData> *)
            ((long)&texFmt.type + 3);
  std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>::allocator(this_02)
  ;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ::vector((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
            *)&ndx,sVar25,this_02);
  std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>::~allocator
            ((allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData> *)
             ((long)&texFmt.type + 3));
  for (texFmt.order = R;
      (int)texFmt.order <
      drawBuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; texFmt.order = texFmt.order + A) {
    pvVar26 = std::
              vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              ::operator[](&this->m_fboSpec,(long)(int)texFmt.order);
    _CStack_110 = glu::mapGLInternalFormat(pvVar26->format);
    TVar16 = tcu::getTextureChannelClass(chnClass);
    if (TVar16 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      tcu::TextureFormat::TextureFormat(&readFmt,CStack_110,FLOAT);
    }
    else {
      readFmt = _CStack_110;
    }
    _attachmentH = FboTestUtil::getFramebufferReadFormat((TextureFormat *)&stack0xfffffffffffffef0);
    pvVar26 = std::
              vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              ::operator[](&this->m_fboSpec,(long)(int)texFmt.order);
    quadNdx = pvVar26->width;
    pvVar26 = std::
              vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              ::operator[](&this->m_fboSpec,(long)(int)texFmt.order);
    quadY = pvVar26->height;
    vVar17 = texFmt.order + 0x8ce0;
    pvVar27 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0,
                         (long)(int)texFmt.order);
    *pvVar27 = vVar17;
    pvVar28 = std::
              vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
              ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                            *)&ndx,(long)(int)texFmt.order);
    pvVar28->format = _CStack_110;
    pvVar28 = std::
              vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
              ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                            *)&ndx,(long)(int)texFmt.order);
    pvVar28->readFormat = _attachmentH;
    pvVar28 = std::
              vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
              ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                            *)&ndx,(long)(int)texFmt.order);
    pvVar28->referenceFormat = readFmt;
    pvVar28 = std::
              vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
              ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                            *)&ndx,(long)(int)texFmt.order);
    iVar18 = tcu::TextureFormat::getPixelSize((TextureFormat *)&attachmentH);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&pvVar28->renderedData,(long)(iVar18 * quadNdx * quadY));
    pvVar28 = std::
              vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
              ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                            *)&ndx,(long)(int)texFmt.order);
    iVar18 = tcu::TextureFormat::getPixelSize(&readFmt);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&pvVar28->referenceData,(long)(iVar18 * quadNdx * quadY));
  }
  for (quadX = 0; quadX < iVar14 * iVar15; quadX = quadX + 1) {
    y = quadX / iVar14;
    x = quadX - y * iVar14;
    sVar6 = (short)y;
    sVar7 = (short)gridWidth_00;
    sVar5 = (short)x;
    pvVar29 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment,
                         (long)(quadX * 6));
    *pvVar29 = sVar5 + sVar6 * sVar7;
    sVar6 = (short)y;
    sVar5 = (short)x;
    pvVar29 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment,
                         (long)(quadX * 6 + 1));
    *pvVar29 = sVar5 + (sVar6 + 1) * sVar7;
    sVar6 = (short)y;
    sVar5 = (short)x;
    pvVar29 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment,
                         (long)(quadX * 6 + 2));
    *pvVar29 = sVar5 + sVar6 * sVar7 + 1;
    pvVar29 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment,
                         (long)(quadX * 6 + 1));
    vVar1 = *pvVar29;
    pvVar29 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment,
                         (long)(quadX * 6 + 3));
    *pvVar29 = vVar1;
    sVar6 = (short)y;
    sVar5 = (short)x;
    pvVar29 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment,
                         (long)(quadX * 6 + 4));
    *pvVar29 = sVar5 + (sVar6 + 1) * sVar7 + 1;
    pvVar29 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment,
                         (long)(quadX * 6 + 2));
    vVar1 = *pvVar29;
    pvVar29 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment,
                         (long)(quadX * 6 + 5));
    *pvVar29 = vVar1;
  }
  for (xf = 0.0; (int)xf < gridHeight_00; xf = (float)((int)xf + 1)) {
    for (yf = 0.0; (int)yf < gridWidth_00; yf = (float)((int)yf + 1)) {
      curInVec = (int)((float)(int)yf / (float)iVar14);
      outputNdx = (int)((float)(int)xf / (float)iVar15);
      fVar46 = (float)curInVec + (float)curInVec;
      pvVar30 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_90,
                           (long)(((int)xf * gridWidth_00 + (int)yf) * 4));
      *pvVar30 = fVar46 + -1.0;
      fVar46 = (float)outputNdx + (float)outputNdx;
      pvVar30 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_90,
                           (long)(((int)xf * gridWidth_00 + (int)yf) * 4 + 1));
      *pvVar30 = fVar46 + -1.0;
      pvVar30 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_90,
                           (long)(((int)xf * gridWidth_00 + (int)yf) * 4 + 2));
      *pvVar30 = 0.0;
      pvVar30 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_90,
                           (long)(((int)xf * gridWidth_00 + (int)yf) * 4 + 3));
      *pvVar30 = 1.0;
    }
  }
  local_150 = 0;
  for (output._4_4_ = 0;
      sVar25 = std::
               vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
               ::size(&this->m_outputs), output._4_4_ < (int)sVar25; output._4_4_ = output._4_4_ + 1
      ) {
    pvVar31 = std::
              vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
              ::operator[](&this->m_outputs,(long)output._4_4_);
    bVar9 = glu::isDataTypeFloatOrVec(pvVar31->type);
    bVar10 = glu::isDataTypeIntOrIVec(pvVar31->type);
    bVar11 = glu::isDataTypeUintOrUVec(pvVar31->type);
    if (pvVar31->arrayLength < 1) {
      local_14a8 = 1;
    }
    else {
      local_14a8 = pvVar31->arrayLength;
    }
    iVar18 = glu::getDataTypeScalarSize(pvVar31->type);
    for (range.m_data[0] = 0.0; (int)range.m_data[0] < local_14a8;
        range.m_data[0] = (float)((int)range.m_data[0] + 1)) {
      pvVar32 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)local_60,(long)local_150);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (pvVar32,(long)(gridWidth_00 * gridHeight_00 * iVar18));
      pvVar28 = std::
                vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                              *)&ndx,(long)(pvVar31->location + (int)range.m_data[0]));
      pvVar28->numWrittenChannels = iVar18;
      PVar2 = pvVar31->precision;
      pvVar28 = std::
                vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                              *)&ndx,(long)(pvVar31->location + (int)range.m_data[0]));
      pvVar28->outPrecision = PVar2;
      if (bVar9) {
        getFloatRange((Functional *)(minVal.m_data + 2),pvVar31->precision);
        pfVar33 = tcu::Vector<float,_2>::x((Vector<float,_2> *)(minVal.m_data + 2));
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(maxVal.m_data + 2),*pfVar33);
        pfVar33 = tcu::Vector<float,_2>::y((Vector<float,_2> *)(minVal.m_data + 2));
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&dst,*pfVar33);
        pvVar32 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)local_60,(long)local_150);
        fmtInfo.lookupBias.m_data._8_8_ =
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar32,0);
        iVar19 = pvVar31->location;
        sVar25 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                 ::size((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                         *)&ndx);
        bVar12 = de::inBounds<int>(iVar19 + (int)range.m_data[0],0,(int)sVar25);
        if (bVar12) {
          pvVar28 = std::
                    vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                    ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                  *)&ndx,(long)(pvVar31->location + (int)range.m_data[0]));
          tcu::getTextureFormatInfo((TextureFormatInfo *)local_1e0,&pvVar28->format);
          tcu::max<float,4>(local_1f0,(Vector<float,_4> *)(maxVal.m_data + 2),
                            (Vector<float,_4> *)local_1e0);
          maxVal.m_data._8_8_ = local_1f0;
          minVal.m_data[0] = afStack_1e8[0];
          minVal.m_data[1] = afStack_1e8[1];
          tcu::min<float,4>((tcu *)&local_200,(Vector<float,_4> *)&dst,
                            (Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2));
          dst = local_200;
          maxVal.m_data[0] = local_1f8[0];
          maxVal.m_data[1] = local_1f8[1];
        }
        pTVar34 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_380,pTVar34,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar35 = tcu::MessageBuilder::operator<<(&local_380,(char (*) [4])0x12b5e41);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&local_150);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [15])" value range: ");
        anon_unknown_7::valueRangeToString<float>
                  ((string *)&x_1,iVar18,(Vector<float,_4> *)(maxVal.m_data + 2),
                   (Vector<float,_4> *)&dst);
        pMVar35 = tcu::MessageBuilder::operator<<
                            (pMVar35,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&x_1);
        tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&x_1);
        tcu::MessageBuilder::~MessageBuilder(&local_380);
        for (xf_1 = 0.0; (int)xf_1 < gridHeight_00; xf_1 = (float)((int)xf_1 + 1)) {
          for (yf_1 = 0.0; (int)yf_1 < gridWidth_00; yf_1 = (float)((int)yf_1 + 1)) {
            f.m_data[3] = ((float)(int)yf_1 / (float)iVar14 + (float)(int)xf_1 / (float)iVar15) *
                          0.5;
            f.m_data[2] = ((float)(int)yf_1 / (float)iVar14 - (float)(int)xf_1 / (float)iVar15) *
                          0.5 + 0.5;
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)(c.m_data + 2),f.m_data[3],f.m_data[2],1.0 - f.m_data[3],
                       1.0 - f.m_data[2]);
            swizzleVec<float>((Functional *)local_3c8,(Vector<float,_4> *)(c.m_data + 2),local_150);
            tcu::operator-((tcu *)&v,(Vector<float,_4> *)&dst,
                           (Vector<float,_4> *)(maxVal.m_data + 2));
            tcu::operator*((tcu *)&local_3f8,(Vector<float,_4> *)&v,(Vector<float,_4> *)local_3c8);
            tcu::operator+((tcu *)local_3e8,(Vector<float,_4> *)(maxVal.m_data + 2),&local_3f8);
            register0x00000000 =
                 fmtInfo.lookupBias.m_data._8_8_ +
                 (long)(((int)xf_1 * gridWidth_00 + (int)yf_1) * iVar18) * 4;
            for (range_1.m_data[0] = 0; range_1.m_data[0] < iVar18;
                range_1.m_data[0] = range_1.m_data[0] + 1) {
              pfVar33 = tcu::Vector<float,_4>::operator[]
                                  ((Vector<float,_4> *)local_3e8,range_1.m_data[0]);
              *(float *)(stack0xfffffffffffffbf0 + (long)range_1.m_data[0] * 4) = *pfVar33;
            }
          }
        }
      }
      else if (bVar10) {
        getIntRange((Functional *)&local_41c,pvVar31->precision);
        iVar19 = tcu::Vector<int,_2>::x(&local_41c);
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(maxVal_1.m_data + 2),iVar19);
        iVar19 = tcu::Vector<int,_2>::y(&local_41c);
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(fmtBits.m_data + 2),iVar19);
        iVar19 = pvVar31->location;
        sVar25 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                 ::size((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                         *)&ndx);
        bVar12 = de::inBounds<int>(iVar19 + (int)range.m_data[0],0,(int)sVar25);
        if (bVar12) {
          pvVar28 = std::
                    vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                    ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                  *)&ndx,(long)(pvVar31->location + (int)range.m_data[0]));
          tcu::getTextureFormatBitDepth((tcu *)local_458,&pvVar28->format);
          tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(fmtMinVal.m_data + 2),0);
          tcu::lessThanEqual<int,4>
                    ((tcu *)&local_45c,(Vector<int,_4> *)local_458,
                     (Vector<int,_4> *)(fmtMinVal.m_data + 2));
          tcu::Vector<long,_4>::Vector(&local_4e0,1);
          tcu::operator-((tcu *)(fmtMaxVal.m_data + 2),(Vector<int,_4> *)local_458,1);
          tcu::Vector<int,_4>::cast<long>(&local_500,(Vector<int,_4> *)(fmtMaxVal.m_data + 2));
          tcu::operator<<(&local_4c0,&local_4e0,&local_500);
          tcu::operator-(&local_4a0,(tcu *)&local_4c0,a);
          tcu::Vector<long,_4>::asInt((Vector<long,_4> *)local_47c);
          tcu::Vector<long,_4>::Vector(&local_580,1);
          tcu::operator-((tcu *)&local_5b0,(Vector<int,_4> *)local_458,1);
          tcu::Vector<int,_4>::cast<long>(&local_5a0,&local_5b0);
          tcu::operator<<(&local_560,&local_580,&local_5a0);
          tcu::operator-(&local_540,&local_560,1);
          tcu::Vector<long,_4>::asInt((Vector<long,_4> *)local_520);
          tcu::max<int,4>((tcu *)&local_5d0,(Vector<int,_4> *)(maxVal_1.m_data + 2),
                          (Vector<int,_4> *)local_47c);
          tcu::select<int,4>(local_5c0,(Vector<int,_4> *)(maxVal_1.m_data + 2),&local_5d0,&local_45c
                            );
          maxVal_1.m_data._8_8_ = local_5c0._0_8_;
          tcu::min<int,4>((tcu *)&local_5f0,(Vector<int,_4> *)(fmtBits.m_data + 2),
                          (Vector<int,_4> *)local_520);
          tcu::select<int,4>(local_5e0,(Vector<int,_4> *)(fmtBits.m_data + 2),&local_5f0,&local_45c)
          ;
          fmtBits.m_data._8_8_ = local_5e0;
          maxVal_1.m_data[0] = local_5d8[0];
          maxVal_1.m_data[1] = local_5d8[1];
        }
        pTVar34 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_770,pTVar34,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar35 = tcu::MessageBuilder::operator<<(&local_770,(char (*) [4])0x12b5e41);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&local_150);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [15])" value range: ");
        anon_unknown_7::valueRangeToString<int>
                  ((string *)(rangeDiv.m_data + 2),iVar18,(Vector<int,_4> *)(maxVal_1.m_data + 2),
                   (Vector<int,_4> *)(fmtBits.m_data + 2));
        pMVar35 = tcu::MessageBuilder::operator<<
                            (pMVar35,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(rangeDiv.m_data + 2));
        tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)(rangeDiv.m_data + 2));
        tcu::MessageBuilder::~MessageBuilder(&local_770);
        tcu::Vector<int,_4>::Vector
                  ((Vector<int,_4> *)(step.m_data + 2),gridWidth_00,gridHeight_00,gridWidth_00,
                   gridHeight_00);
        tcu::operator-((tcu *)&local_7b0,(Vector<int,_4> *)(step.m_data + 2),1);
        swizzleVec<int>((Functional *)local_7a0,&local_7b0,local_150);
        tcu::Vector<int,_4>::cast<long>(&local_830,(Vector<int,_4> *)(fmtBits.m_data + 2));
        tcu::Vector<int,_4>::cast<long>(&local_850,(Vector<int,_4> *)(maxVal_1.m_data + 2));
        tcu::operator-(&local_810,&local_830,&local_850);
        tcu::Vector<int,_4>::cast<long>((Vector<long,_4> *)&dst_1,(Vector<int,_4> *)local_7a0);
        tcu::operator/(&local_7f0,&local_810,(Vector<long,_4> *)&dst_1);
        tcu::Vector<long,_4>::asInt((Vector<long,_4> *)local_7d0);
        pvVar32 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)local_60,(long)local_150);
        pvVar27 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar32,0);
        for (ix = 0; ix < gridHeight_00; ix = ix + 1) {
          for (iy = 0; iy < gridWidth_00; iy = iy + 1) {
            c_1.m_data[3] = ~iy + gridWidth_00;
            c_1.m_data[2] = ~ix + gridHeight_00;
            tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&v_1,iy,ix,c_1.m_data[3],c_1.m_data[2]);
            swizzleVec<int>((Functional *)&local_8b8,(Vector<int,_4> *)&v_1,local_150);
            tcu::operator*((tcu *)&local_8a8,(Vector<int,_4> *)local_7d0,&local_8b8);
            tcu::operator+((tcu *)local_898,(Vector<int,_4> *)(maxVal_1.m_data + 2),&local_8a8);
            for (range_2.m_data[0] = 0; (int)range_2.m_data[0] < iVar18;
                range_2.m_data[0] = range_2.m_data[0] + 1) {
              pvVar36 = (value_type *)
                        tcu::Vector<int,_4>::operator[]
                                  ((Vector<int,_4> *)local_898,range_2.m_data[0]);
              pvVar27[(long)((ix * gridWidth_00 + iy) * iVar18) + (long)(int)range_2.m_data[0]] =
                   *pvVar36;
            }
          }
        }
      }
      else if (bVar11) {
        getUintRange((Functional *)(maxVal_2.m_data + 2),pvVar31->precision);
        uVar20 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)(maxVal_2.m_data + 2));
        tcu::Vector<unsigned_int,_4>::Vector
                  ((Vector<unsigned_int,_4> *)(fmtBits_1.m_data + 2),uVar20);
        iVar19 = pvVar31->location;
        sVar25 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                 ::size((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                         *)&ndx);
        bVar12 = de::inBounds<int>(iVar19 + (int)range.m_data[0],0,(int)sVar25);
        if (bVar12) {
          pvVar28 = std::
                    vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                    ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                  *)&ndx,(long)(pvVar31->location + (int)range.m_data[0]));
          tcu::getTextureFormatBitDepth((tcu *)(fmtMaxVal_1.m_data + 2),&pvVar28->format);
          tcu::Vector<unsigned_long,_4>::Vector(&local_970,1);
          tcu::Vector<int,_4>::cast<unsigned_long>
                    (&local_990,(Vector<int,_4> *)(fmtMaxVal_1.m_data + 2));
          tcu::operator<<(&local_950,&local_970,&local_990);
          tcu::operator-(&local_930,&local_950,1);
          tcu::Vector<unsigned_long,_4>::asUint((Vector<unsigned_long,_4> *)local_90c);
          tcu::min<unsigned_int,4>
                    (local_9a0,(Vector<unsigned_int,_4> *)(fmtBits_1.m_data + 2),
                     (Vector<unsigned_int,_4> *)local_90c);
          fmtBits_1.m_data._8_8_ = local_9a0;
          maxVal_2.m_data[0] = local_998[0];
          maxVal_2.m_data[1] = local_998[1];
        }
        pTVar34 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_b20,pTVar34,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar35 = tcu::MessageBuilder::operator<<(&local_b20,(char (*) [4])0x12b5e41);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&local_150);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [15])" value range: ");
        tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)(rangeDiv_1.m_data + 2),0);
        anon_unknown_7::valueRangeToString<unsigned_int>
                  (&local_b40,iVar18,(Vector<unsigned_int,_4> *)(rangeDiv_1.m_data + 2),
                   (Vector<unsigned_int,_4> *)(fmtBits_1.m_data + 2));
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&local_b40);
        tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_b40);
        tcu::MessageBuilder::~MessageBuilder(&local_b20);
        tcu::Vector<int,_4>::Vector
                  ((Vector<int,_4> *)(step_1.m_data + 2),gridWidth_00,gridHeight_00,gridWidth_00,
                   gridHeight_00);
        tcu::operator-((tcu *)&local_b70,(Vector<int,_4> *)(step_1.m_data + 2),1);
        swizzleVec<int>(local_b60,&local_b70,local_150);
        tcu::Vector<int,_4>::asUint((Vector<int,_4> *)&dst_2);
        tcu::operator/((tcu *)local_b90,(Vector<unsigned_int,_4> *)(fmtBits_1.m_data + 2),
                       (Vector<unsigned_int,_4> *)&dst_2);
        pvVar32 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)local_60,(long)local_150);
        pvVar27 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar32,0);
        for (ix_1 = 0; ix_1 < gridHeight_00; ix_1 = ix_1 + 1) {
          for (iy_1 = 0; iy_1 < gridWidth_00; iy_1 = iy_1 + 1) {
            c_2.m_data[3] = ~iy_1 + gridWidth_00;
            c_2.m_data[2] = ~ix_1 + gridHeight_00;
            tcu::Vector<int,_4>::Vector
                      ((Vector<int,_4> *)&v_2,iy_1,ix_1,c_2.m_data[3],c_2.m_data[2]);
            tcu::Vector<int,_4>::asUint((Vector<int,_4> *)&local_be8);
            swizzleVec<unsigned_int>((Functional *)&local_bd8,&local_be8,local_150);
            tcu::operator*((tcu *)local_bc8,(Vector<unsigned_int,_4> *)local_b90,&local_bd8);
            _curInVec_1 = pvVar27 + (ix_1 * gridWidth_00 + iy_1) * iVar18;
            for (outputNdx_1 = 0; outputNdx_1 < iVar18; outputNdx_1 = outputNdx_1 + 1) {
              puVar37 = tcu::Vector<unsigned_int,_4>::operator[]
                                  ((Vector<unsigned_int,_4> *)local_bc8,outputNdx_1);
              _curInVec_1[outputNdx_1] = *puVar37;
            }
          }
        }
      }
      local_150 = local_150 + 1;
    }
  }
  pcVar4 = *(code **)(stack0xffffffffffffffe0 + 0x1680);
  dVar21 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar4)(dVar21);
  (**(code **)(stack0xffffffffffffffe0 + 0x78))(0x8d40,this->m_framebuffer);
  (**(code **)(stack0xffffffffffffffe0 + 0x1a00))(0,0,width,height);
  pcVar4 = *(code **)(stack0xffffffffffffffe0 + 0x560);
  sVar25 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
  pvVar27 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0,0);
  (*pcVar4)(sVar25 & 0xffffffff,pvVar27);
  (**(code **)(stack0xffffffffffffffe0 + 0x4e8))(0xbd0);
  dVar21 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar21,"After program setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x303);
  local_c08 = 0;
  for (output_1._4_4_ = 0; iVar14 = output_1._4_4_,
      sVar25 = std::
               vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
               ::size(&this->m_outputs), iVar14 < (int)sVar25; output_1._4_4_ = output_1._4_4_ + 1)
  {
    pvVar31 = std::
              vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
              ::operator[](&this->m_outputs,(long)output_1._4_4_);
    bVar9 = pvVar31->arrayLength < 1;
    bVar10 = glu::isDataTypeFloatOrVec(pvVar31->type);
    bVar11 = glu::isDataTypeIntOrIVec(pvVar31->type);
    bVar12 = glu::isDataTypeUintOrUVec(pvVar31->type);
    iVar14 = glu::getDataTypeScalarSize(pvVar31->type);
    if (bVar10) {
      local_15cc = 0x1406;
    }
    else {
      if (bVar11) {
        local_15d0 = 0x1404;
      }
      else {
        local_15d0 = 0;
        if (bVar12) {
          local_15d0 = 0x1405;
        }
      }
      local_15cc = local_15d0;
    }
    if (bVar9) {
      local_15d4 = 1;
    }
    else {
      local_15d4 = pvVar31->arrayLength;
    }
    for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < local_15d4;
        name.field_2._12_4_ = name.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c90,"in",&local_c91);
      de::toString<int>(&local_cb8,(int *)((long)&output_1 + 4));
      std::operator+(&local_c70,&local_c90,&local_cb8);
      local_cfa = 0;
      local_cfb = 0;
      local_d21 = 0;
      if (bVar9) {
        std::__cxx11::string::string((string *)&local_cd8);
      }
      else {
        std::allocator<char>::allocator();
        local_cfa = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_cf8,"_",&local_cf9);
        local_cfb = 1;
        de::toString<int>((string *)&loc,(int *)(name.field_2._M_local_buf + 0xc));
        local_d21 = 1;
        std::operator+(&local_cd8,&local_cf8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c50,
                     &local_c70,&local_cd8);
      std::__cxx11::string::~string((string *)&local_cd8);
      if ((local_d21 & 1) != 0) {
        std::__cxx11::string::~string((string *)&loc);
      }
      if ((local_cfb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_cf8);
      }
      if ((local_cfa & 1) != 0) {
        std::allocator<char>::~allocator(&local_cf9);
      }
      std::__cxx11::string::~string((string *)&local_c70);
      std::__cxx11::string::~string((string *)&local_cb8);
      std::__cxx11::string::~string((string *)&local_c90);
      std::allocator<char>::~allocator(&local_c91);
      pcVar4 = *(code **)(stack0xffffffffffffffe0 + 0x780);
      dVar21 = glu::ShaderProgram::getProgram(this->m_program);
      uVar38 = std::__cxx11::string::c_str();
      local_d28 = (*pcVar4)(dVar21,uVar38);
      if (local_d28 < 0) {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&ndx_4,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar35 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&ndx_4,
                             (char (*) [37])"Warning: No location for attribute \'");
        pMVar35 = tcu::MessageBuilder::operator<<
                            (pMVar35,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_c50);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [9])"\' found.");
        tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx_4);
      }
      else {
        (**(code **)(stack0xffffffffffffffe0 + 0x610))(local_d28);
        iVar15 = local_d28;
        if (bVar10) {
          pcVar4 = *(code **)(stack0xffffffffffffffe0 + 0x19f0);
          pvVar32 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)local_60,(long)local_c08);
          pvVar27 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar32,0);
          (*pcVar4)(iVar15,iVar14,local_15cc,0,0,pvVar27);
        }
        else {
          pcVar4 = *(code **)(stack0xffffffffffffffe0 + 0x1958);
          pvVar32 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)local_60,(long)local_c08);
          pvVar27 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar32,0);
          (*pcVar4)(iVar15,iVar14,local_15cc,0,pvVar27);
        }
      }
      local_c08 = local_c08 + 1;
      std::__cxx11::string::~string((string *)local_c50);
    }
  }
  pcVar4 = *(code **)(stack0xffffffffffffffe0 + 0x780);
  dVar21 = glu::ShaderProgram::getProgram(this->m_program);
  iVar14 = (*pcVar4)(dVar21,"a_position");
  while ((dVar22 = ::deGetFalse(), dVar22 == 0 && (-1 < iVar14))) {
    dVar22 = ::deGetFalse();
    if (dVar22 == 0) {
      (**(code **)(stack0xffffffffffffffe0 + 0x610))(iVar14);
      pcVar4 = *(code **)(stack0xffffffffffffffe0 + 0x19f0);
      pvVar30 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_90,0);
      (*pcVar4)(iVar14,4,0x1406,0,0,pvVar30);
      dVar21 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
      glu::checkError(dVar21,"After attribute setup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                      ,0x32e);
      pcVar4 = *(code **)(stack0xffffffffffffffe0 + 0x568);
      pvVar29 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment
                           ,0);
      (*pcVar4)(4,iVar13,0x1403,pvVar29);
      dVar21 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
      glu::checkError(dVar21,"glDrawElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                      ,0x331);
      for (transferFmt.format = 0;
          (int)transferFmt.format <
          drawBuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
          transferFmt.format = transferFmt.format + 1) {
        pvVar28 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)(int)transferFmt.format);
        TVar40 = glu::getTransferFormat(pvVar28->readFormat);
        pvVar28 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)(int)transferFmt.format);
        pvVar41 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&pvVar28->renderedData,0);
        pvVar26 = std::
                  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  ::operator[](&this->m_fboSpec,(long)(int)transferFmt.format);
        iVar13 = pvVar26->width;
        pvVar26 = std::
                  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  ::operator[](&this->m_fboSpec,(long)(int)transferFmt.format);
        iVar14 = pvVar26->height;
        pvVar28 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)(int)transferFmt.format);
        rendered.super_ConstPixelBufferAccess.m_data._4_4_ = pvVar28->numWrittenChannels;
        pvVar28 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)(int)transferFmt.format);
        pvVar42 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)(int)transferFmt.format);
        iVar15 = tcu::TextureFormat::getPixelSize(&pvVar42->readFormat);
        dVar23 = deAlign32(iVar15 * iVar13,4);
        pvVar42 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)(int)transferFmt.format);
        data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pvVar42->renderedData,0);
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&outputNdx_2,&pvVar28->readFormat,iVar13,iVar14,1,dVar23,0,
                   data);
        (**(code **)(stack0xffffffffffffffe0 + 0x1218))(transferFmt.format + 0x8ce0);
        pcVar4 = *(code **)(stack0xffffffffffffffe0 + 0x1220);
        iVar13 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&gridHeight);
        iVar14 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&gridHeight);
        dStack_eb4 = TVar40.dataType;
        (*pcVar4)(0,0,iVar13,iVar14,(ulong)TVar40 & 0xffffffff,dStack_eb4,pvVar41);
        anon_unknown_7::clearUndefined
                  ((PixelBufferAccess *)&outputNdx_2,
                   rendered.super_ConstPixelBufferAccess.m_data._4_4_);
      }
      output_2._4_4_ = 0;
      for (output_2._0_4_ = 0;
          sVar25 = std::
                   vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   ::size(&this->m_outputs), (int)output_2 < (int)sVar25;
          output_2._0_4_ = (int)output_2 + 1) {
        pvVar31 = std::
                  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  ::operator[](&this->m_outputs,(long)(int)output_2);
        iVar13 = pvVar31->arrayLength;
        bVar9 = glu::isDataTypeFloatOrVec(pvVar31->type);
        bVar10 = glu::isDataTypeIntOrIVec(pvVar31->type);
        bVar11 = glu::isDataTypeUintOrUVec(pvVar31->type);
        iVar14 = glu::getDataTypeScalarSize(pvVar31->type);
        if (iVar13 < 1) {
          local_16ec = 1;
        }
        else {
          local_16ec = pvVar31->arrayLength;
        }
        for (local_f20 = 0; local_f20 < local_16ec; local_f20 = local_f20 + 1) {
          iVar18 = pvVar31->location + local_f20;
          pvVar32 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)local_60,(long)output_2._4_4_);
          pfVar33 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                       (pvVar32,0);
          pvVar26 = std::
                    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                    ::operator[](&this->m_fboSpec,(long)iVar18);
          iVar13 = pvVar26->width;
          pvVar26 = std::
                    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                    ::operator[](&this->m_fboSpec,(long)iVar18);
          iVar15 = pvVar26->height;
          pvVar28 = std::
                    vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                    ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                  *)&ndx,(long)iVar18);
          pvVar42 = std::
                    vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                    ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                  *)&ndx,(long)iVar18);
          pvVar41 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (&pvVar42->referenceData,0);
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)&viewportBuf.super_ConstPixelBufferAccess.m_data,
                     &pvVar28->referenceFormat,iVar13,iVar15,1,pvVar41);
          tcu::getSubregion((PixelBufferAccess *)&attachNdx,
                            (PixelBufferAccess *)&viewportBuf.super_ConstPixelBufferAccess.m_data,0,
                            0,0,width,height,1);
          if ((bVar10) || (bVar11)) {
            renderIntReference((PixelBufferAccess *)&attachNdx,gridWidth_00,gridHeight_00,iVar14,
                               (int *)pfVar33);
          }
          else if (bVar9) {
            renderFloatReference
                      ((PixelBufferAccess *)&attachNdx,gridWidth_00,gridHeight_00,iVar14,pfVar33);
          }
          output_2._4_4_ = output_2._4_4_ + 1;
        }
      }
      attachmentW_2._3_1_ = 1;
      attachmentH_2 = 0;
      do {
        if (drawBuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ <= attachmentH_2) {
          pcVar44 = "Image comparison failed";
          if ((attachmentW_2._3_1_ & 1) != 0) {
            pcVar44 = "Pass";
          }
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     (byte)~attachmentW_2._3_1_ & QP_TEST_RESULT_FAIL,pcVar44);
          std::
          vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
          ::~vector((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                     *)&ndx);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readAlignment);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_90);
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)local_60);
          return STOP;
        }
        pvVar26 = std::
                  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  ::operator[](&this->m_fboSpec,(long)attachmentH_2);
        iVar13 = pvVar26->width;
        pvVar26 = std::
                  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  ::operator[](&this->m_fboSpec,(long)attachmentH_2);
        cmpMask.m_data = (bool  [4])pvVar26->height;
        pvVar28 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)attachmentH_2);
        outPrecision = pvVar28->numWrittenChannels;
        tcu::Vector<bool,_4>::Vector
                  (&local_fa0,0 < (int)outPrecision,1 < (int)outPrecision,2 < (int)outPrecision,
                   3 < (int)outPrecision);
        pvVar28 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)attachmentH_2);
        PVar2 = pvVar28->outPrecision;
        pvVar28 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)attachmentH_2);
        pvVar42 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)attachmentH_2);
        BVar8 = cmpMask;
        pvVar43 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)attachmentH_2);
        iVar14 = tcu::TextureFormat::getPixelSize(&pvVar43->readFormat);
        dVar23 = deAlign32(iVar14 * iVar13,4);
        pvVar43 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)attachmentH_2);
        pvVar41 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&pvVar43->renderedData,0);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&reference.m_data,&pvVar42->readFormat,iVar13,
                   (int)BVar8.m_data,1,dVar23,0,pvVar41);
        pvVar42 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)attachmentH_2);
        BVar8 = cmpMask;
        pvVar43 = std::
                  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                *)&ndx,(long)attachmentH_2);
        pvVar41 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&pvVar43->referenceData,0);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_1000,&pvVar42->referenceFormat,iVar13,
                   (int)BVar8.m_data,1,pvVar41);
        name_1.field_2._12_4_ = tcu::getTextureChannelClass((pvVar28->format).type);
        name_1.field_2._M_local_buf[0xb] = '\x01';
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1048,"Attachment",&local_1049);
        de::toString<int>((string *)((long)&desc.field_2 + 8),&attachmentH_2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1028,&local_1048,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&desc.field_2 + 8));
        std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_1048);
        std::allocator<char>::~allocator(&local_1049);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10b0,"Color attachment ",&local_10b1);
        de::toString<int>(&local_10d8,&attachmentH_2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1090,&local_10b0,&local_10d8);
        std::__cxx11::string::~string((string *)&local_10d8);
        std::__cxx11::string::~string((string *)&local_10b0);
        std::allocator<char>::~allocator(&local_10b1);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&outTypeThreshold,this_03,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar35 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&outTypeThreshold,(char (*) [12])"Attachment ");
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&attachmentH_2);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [3])0x12835f3);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(int *)&outPrecision);
        pMVar35 = tcu::MessageBuilder::operator<<
                            (pMVar35,(char (*) [54])
                                     " channels have defined values and used for comparison");
        tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&outTypeThreshold);
        if (name_1.field_2._12_4_ == 1) {
          tcu::Vector<int,_4>::Vector(&local_1318,8);
          tcu::getTextureFormatBitDepth((tcu *)(baseThreshold.m_data + 2),&pvVar28->format);
          tcu::min<int,4>((tcu *)local_1308,&local_1318,(Vector<int,_4> *)(baseThreshold.m_data + 2)
                         );
          tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(threshold.m_data + 2),1);
          tcu::operator<<((tcu *)&local_1368,(Vector<int,_4> *)(threshold.m_data + 2),
                          (Vector<int,_4> *)local_1308);
          tcu::operator-(local_1358,&local_1368,1);
          tcu::Vector<int,_4>::asFloat((Vector<int,_4> *)&local_1348);
          tcu::operator/((tcu *)local_1338,1.0,&local_1348);
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(threshold_1.m_data + 2),2.0);
          tcu::select<float,4>
                    ((tcu *)local_1388,(Vector<float,_4> *)local_1338,
                     (Vector<float,_4> *)(threshold_1.m_data + 2),&local_fa0);
          pcVar44 = (char *)std::__cxx11::string::c_str();
          pcVar45 = (char *)std::__cxx11::string::c_str();
          name_1.field_2._M_local_buf[0xb] =
               tcu::floatThresholdCompare
                         (this_03,pcVar44,pcVar45,(ConstPixelBufferAccess *)local_1000,
                          (ConstPixelBufferAccess *)&reference.m_data,(Vec4 *)local_1388,
                          COMPARE_LOG_RESULT);
        }
        else if (name_1.field_2._12_4_ - 2 < 2) {
          tcu::Vector<unsigned_int,_4>::Vector(&local_13b8,0);
          tcu::Vector<unsigned_int,_4>::Vector(&local_13c8,0xffffffff);
          tcu::select<unsigned_int,4>((tcu *)local_13a8,&local_13b8,&local_13c8,&local_fa0);
          pcVar44 = (char *)std::__cxx11::string::c_str();
          pcVar45 = (char *)std::__cxx11::string::c_str();
          name_1.field_2._M_local_buf[0xb] =
               tcu::intThresholdCompare
                         (this_03,pcVar44,pcVar45,(ConstPixelBufferAccess *)local_1000,
                          (ConstPixelBufferAccess *)&reference.m_data,(UVec4 *)local_13a8,
                          COMPARE_LOG_RESULT);
        }
        else {
          if (name_1.field_2._12_4_ != 4) {
            pTVar39 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar39,"Unsupported comparison",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                       ,0x3b4);
            __cxa_throw(pTVar39,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          formatThreshold.m_data[3] = 4;
          formatThreshold.m_data[2] = 0;
          tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)local_1270);
          tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)auStack_1288);
          CVar3 = (pvVar28->format).type;
          if (CVar3 == UNSIGNED_INT_11F_11F_10F_REV) {
            tcu::Vector<unsigned_int,_4>::Vector(&local_12b8,0x20000,0x20000,0x40000,0);
            local_1270._0_4_ = local_12b8.m_data[0];
            local_1270._4_4_ = local_12b8.m_data[1];
            formatThreshold.m_data[0] = local_12b8.m_data[2];
            formatThreshold.m_data[1] = local_12b8.m_data[3];
          }
          else if (CVar3 == HALF_FLOAT) {
            tcu::Vector<unsigned_int,_4>::Vector(&local_12a8,0x2000);
            local_1270._0_4_ = local_12a8.m_data[0];
            local_1270._4_4_ = local_12a8.m_data[1];
            formatThreshold.m_data[0] = local_12a8.m_data[2];
            formatThreshold.m_data[1] = local_12a8.m_data[3];
          }
          else if (CVar3 == FLOAT) {
            tcu::Vector<unsigned_int,_4>::Vector(&local_1298,0);
            local_1270._0_4_ = local_1298.m_data[0];
            local_1270._4_4_ = local_1298.m_data[1];
            formatThreshold.m_data[0] = local_1298.m_data[2];
            formatThreshold.m_data[1] = local_1298.m_data[3];
          }
          if (PVar2 == PRECISION_LOWP) {
            formatThreshold.m_data[2] = 0x8000;
          }
          else if (PVar2 == PRECISION_MEDIUMP) {
            formatThreshold.m_data[2] = 0x2000;
          }
          else if (PVar2 == PRECISION_HIGHP) {
            formatThreshold.m_data[2] = 0;
          }
          uVar20 = deMax32(4,formatThreshold.m_data[2]);
          tcu::Vector<unsigned_int,_4>::Vector(&local_12e8,uVar20);
          tcu::max<unsigned_int,4>
                    ((tcu *)&local_12d8,(Vector<unsigned_int,_4> *)local_1270,&local_12e8);
          tcu::Vector<unsigned_int,_4>::Vector
                    ((Vector<unsigned_int,_4> *)(bits.m_data + 2),0xffffffff);
          tcu::select<unsigned_int,4>
                    (local_12c8,&local_12d8,(Vector<unsigned_int,_4> *)(bits.m_data + 2),&local_fa0)
          ;
          auStack_1288[0] = local_12c8[0];
          auStack_1288[1] = local_12c8[1];
          auStack_1288[2] = local_12c8[2];
          auStack_1288[3] = local_12c8[3];
          auStack_1288[4] = local_12c8[4];
          auStack_1288[5] = local_12c8[5];
          auStack_1288[6] = local_12c8[6];
          auStack_1288[7] = local_12c8[7];
          finalThreshold.m_data[0] = auStack_12c0[0];
          finalThreshold.m_data[1] = auStack_12c0[1];
          pcVar44 = (char *)std::__cxx11::string::c_str();
          pcVar45 = (char *)std::__cxx11::string::c_str();
          name_1.field_2._M_local_buf[0xb] =
               tcu::floatUlpThresholdCompare
                         (this_03,pcVar44,pcVar45,(ConstPixelBufferAccess *)local_1000,
                          (ConstPixelBufferAccess *)&reference.m_data,(UVec4 *)auStack_1288,
                          COMPARE_LOG_RESULT);
        }
        if (name_1.field_2._M_local_buf[0xb] == '\0') {
          attachmentW_2._3_1_ = 0;
        }
        std::__cxx11::string::~string((string *)local_1090);
        std::__cxx11::string::~string((string *)local_1028);
        attachmentH_2 = attachmentH_2 + 1;
      } while( true );
    }
  }
  pTVar39 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar39,(char *)0x0,"posLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
             ,0x32a);
  __cxa_throw(pTVar39,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

FragmentOutputCase::IterateResult FragmentOutputCase::iterate (void)
{
	TestLog&					log					= m_testCtx.getLog();
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();

	// Compute grid size & index list.
	const int					minCellSize			= 8;
	const IVec2					minBufSize			= getMinSize(m_fboSpec);
	const int					gridWidth			= de::clamp(minBufSize.x()/minCellSize, 1, 255)+1;
	const int					gridHeight			= de::clamp(minBufSize.y()/minCellSize, 1, 255)+1;
	const int					numVertices			= gridWidth*gridHeight;
	const int					numQuads			= (gridWidth-1)*(gridHeight-1);
	const int					numIndices			= numQuads*6;

	const int					numInputVecs		= getNumInputVectors(m_outputs);
	vector<vector<deUint32> >	inputs				(numInputVecs);
	vector<float>				positions			(numVertices*4);
	vector<deUint16>			indices				(numIndices);

	const int					readAlignment		= 4;
	const int					viewportW			= minBufSize.x();
	const int					viewportH			= minBufSize.y();
	const int					numAttachments		= (int)m_fboSpec.size();

	vector<deUint32>			drawBuffers			(numAttachments);
	vector<AttachmentData>		attachments			(numAttachments);

	// Initialize attachment data.
	for (int ndx = 0; ndx < numAttachments; ndx++)
	{
		const tcu::TextureFormat		texFmt			= glu::mapGLInternalFormat(m_fboSpec[ndx].format);
		const tcu::TextureChannelClass	chnClass		= tcu::getTextureChannelClass(texFmt.type);
		const bool						isFixedPoint	= chnClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT ||
														  chnClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;

		// \note Fixed-point formats use float reference to enable more accurate result verification.
		const tcu::TextureFormat		refFmt			= isFixedPoint ? tcu::TextureFormat(texFmt.order, tcu::TextureFormat::FLOAT) : texFmt;
		const tcu::TextureFormat		readFmt			= getFramebufferReadFormat(texFmt);
		const int						attachmentW		= m_fboSpec[ndx].width;
		const int						attachmentH		= m_fboSpec[ndx].height;

		drawBuffers[ndx]					= GL_COLOR_ATTACHMENT0+ndx;
		attachments[ndx].format				= texFmt;
		attachments[ndx].readFormat			= readFmt;
		attachments[ndx].referenceFormat	= refFmt;
		attachments[ndx].renderedData.resize(readFmt.getPixelSize()*attachmentW*attachmentH);
		attachments[ndx].referenceData.resize(refFmt.getPixelSize()*attachmentW*attachmentH);
	}

	// Initialize indices.
	for (int quadNdx = 0; quadNdx < numQuads; quadNdx++)
	{
		int	quadY	= quadNdx / (gridWidth-1);
		int quadX	= quadNdx - quadY*(gridWidth-1);

		indices[quadNdx*6+0] = deUint16(quadX + quadY*gridWidth);
		indices[quadNdx*6+1] = deUint16(quadX + (quadY+1)*gridWidth);
		indices[quadNdx*6+2] = deUint16(quadX + quadY*gridWidth + 1);
		indices[quadNdx*6+3] = indices[quadNdx*6+1];
		indices[quadNdx*6+4] = deUint16(quadX + (quadY+1)*gridWidth + 1);
		indices[quadNdx*6+5] = indices[quadNdx*6+2];
	}

	for (int y = 0; y < gridHeight; y++)
	{
		for (int x = 0; x < gridWidth; x++)
		{
			float	xf	= (float)x / (float)(gridWidth-1);
			float	yf	= (float)y / (float)(gridHeight-1);

			positions[(y*gridWidth + x)*4 + 0] = 2.0f*xf - 1.0f;
			positions[(y*gridWidth + x)*4 + 1] = 2.0f*yf - 1.0f;
			positions[(y*gridWidth + x)*4 + 2] = 0.0f;
			positions[(y*gridWidth + x)*4 + 3] = 1.0f;
		}
	}

	// Initialize input vectors.
	{
		int curInVec = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output		= m_outputs[outputNdx];
			bool					isFloat		= glu::isDataTypeFloatOrVec(output.type);
			bool					isInt		= glu::isDataTypeIntOrIVec(output.type);
			bool					isUint		= glu::isDataTypeUintOrUVec(output.type);
			int						numVecs		= output.arrayLength > 0 ? output.arrayLength : 1;
			int						numScalars	= glu::getDataTypeScalarSize(output.type);

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				inputs[curInVec].resize(numVertices*numScalars);

				// Record how many outputs are written in attachment.
				DE_ASSERT(output.location+vecNdx < (int)attachments.size());
				attachments[output.location+vecNdx].numWrittenChannels	= numScalars;
				attachments[output.location+vecNdx].outPrecision		= output.precision;

				if (isFloat)
				{
					Vec2		range	= getFloatRange(output.precision);
					Vec4		minVal	(range.x());
					Vec4		maxVal	(range.y());
					float*		dst		= (float*)&inputs[curInVec][0];

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// \note Floating-point precision conversion is not well-defined. For that reason we must
						//       limit value range to intersection of both data type and render target value ranges.
						const tcu::TextureFormatInfo fmtInfo = tcu::getTextureFormatInfo(attachments[output.location+vecNdx].format);
						minVal = tcu::max(minVal, fmtInfo.valueMin);
						maxVal = tcu::min(maxVal, fmtInfo.valueMax);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: " << valueRangeToString(numScalars, minVal, maxVal) << TestLog::EndMessage;

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							float	xf	= (float)x / (float)(gridWidth-1);
							float	yf	= (float)y / (float)(gridHeight-1);

							float	f0	= (xf + yf) * 0.5f;
							float	f1	= 0.5f + (xf - yf) * 0.5f;
							Vec4	f	= swizzleVec(Vec4(f0, f1, 1.0f-f0, 1.0f-f1), curInVec);
							Vec4	c	= minVal + (maxVal-minVal)*f;
							float*	v	= dst + (y*gridWidth + x)*numScalars;

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else if (isInt)
				{
					const IVec2	range	= getIntRange(output.precision);
					IVec4		minVal	(range.x());
					IVec4		maxVal	(range.y());

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// Limit to range of output format as conversion mode is not specified.
						const IVec4 fmtBits		= tcu::getTextureFormatBitDepth(attachments[output.location+vecNdx].format);
						const BVec4	isZero		= lessThanEqual(fmtBits, IVec4(0));
						const IVec4	fmtMinVal	= (-(tcu::Vector<deInt64, 4>(1) << (fmtBits-1).cast<deInt64>())).asInt();
						const IVec4	fmtMaxVal	= ((tcu::Vector<deInt64, 4>(1) << (fmtBits-1).cast<deInt64>())-deInt64(1)).asInt();

						minVal = select(minVal, tcu::max(minVal, fmtMinVal), isZero);
						maxVal = select(maxVal, tcu::min(maxVal, fmtMaxVal), isZero);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: " << valueRangeToString(numScalars, minVal, maxVal) << TestLog::EndMessage;

					const IVec4	rangeDiv	= swizzleVec((IVec4(gridWidth, gridHeight, gridWidth, gridHeight)-1), curInVec);
					const IVec4	step		= ((maxVal.cast<deInt64>() - minVal.cast<deInt64>()) / (rangeDiv.cast<deInt64>())).asInt();
					deInt32*	dst			= (deInt32*)&inputs[curInVec][0];

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							int			ix	= gridWidth - x - 1;
							int			iy	= gridHeight - y - 1;
							IVec4		c	= minVal + step*swizzleVec(IVec4(x, y, ix, iy), curInVec);
							deInt32*	v	= dst + (y*gridWidth + x)*numScalars;

							DE_ASSERT(boolAll(logicalAnd(greaterThanEqual(c, minVal), lessThanEqual(c, maxVal))));

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else if (isUint)
				{
					const UVec2	range	= getUintRange(output.precision);
					UVec4		maxVal	(range.y());

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// Limit to range of output format as conversion mode is not specified.
						const IVec4	fmtBits		= tcu::getTextureFormatBitDepth(attachments[output.location+vecNdx].format);
						const UVec4	fmtMaxVal	= ((tcu::Vector<deUint64, 4>(1) << fmtBits.cast<deUint64>())-deUint64(1)).asUint();

						maxVal = tcu::min(maxVal, fmtMaxVal);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: "  << valueRangeToString(numScalars, UVec4(0), maxVal) << TestLog::EndMessage;

					const IVec4	rangeDiv	= swizzleVec((IVec4(gridWidth, gridHeight, gridWidth, gridHeight)-1), curInVec);
					const UVec4	step		= maxVal / rangeDiv.asUint();
					deUint32*	dst			= &inputs[curInVec][0];

					DE_ASSERT(range.x() == 0);

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							int			ix	= gridWidth - x - 1;
							int			iy	= gridHeight - y - 1;
							UVec4		c	= step*swizzleVec(IVec4(x, y, ix, iy).asUint(), curInVec);
							deUint32*	v	= dst + (y*gridWidth + x)*numScalars;

							DE_ASSERT(boolAll(lessThanEqual(c, maxVal)));

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else
					DE_ASSERT(false);

				curInVec += 1;
			}
		}
	}

	// Render using gl.
	gl.useProgram(m_program->getProgram());
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	gl.viewport(0, 0, viewportW, viewportH);
	gl.drawBuffers((int)drawBuffers.size(), &drawBuffers[0]);
	gl.disable(GL_DITHER); // Dithering causes issues with unorm formats. Those issues could be worked around in threshold, but it makes validation less accurate.
	GLU_EXPECT_NO_ERROR(gl.getError(), "After program setup");

	{
		int curInVec = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output			= m_outputs[outputNdx];
			bool					isArray			= output.arrayLength > 0;
			bool					isFloat			= glu::isDataTypeFloatOrVec(output.type);
			bool					isInt			= glu::isDataTypeIntOrIVec(output.type);
			bool					isUint			= glu::isDataTypeUintOrUVec(output.type);
			int						scalarSize		= glu::getDataTypeScalarSize(output.type);
			deUint32				glScalarType	= isFloat	? GL_FLOAT			:
													  isInt		? GL_INT			:
													  isUint	? GL_UNSIGNED_INT	: GL_NONE;
			int						numVecs			= isArray ? output.arrayLength : 1;

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				string	name	= string("in") + de::toString(outputNdx) + (isArray ? string("_") + de::toString(vecNdx) : string());
				int		loc		= gl.getAttribLocation(m_program->getProgram(), name.c_str());

				if (loc >= 0)
				{
					gl.enableVertexAttribArray(loc);
					if (isFloat)
						gl.vertexAttribPointer(loc, scalarSize, glScalarType, GL_FALSE, 0, &inputs[curInVec][0]);
					else
						gl.vertexAttribIPointer(loc, scalarSize, glScalarType, 0, &inputs[curInVec][0]);
				}
				else
					log << TestLog::Message << "Warning: No location for attribute '" << name << "' found." << TestLog::EndMessage;

				curInVec += 1;
			}
		}
	}
	{
		int posLoc = gl.getAttribLocation(m_program->getProgram(), "a_position");
		TCU_CHECK(posLoc >= 0);
		gl.enableVertexAttribArray(posLoc);
		gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &positions[0]);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "After attribute setup");

	gl.drawElements(GL_TRIANGLES, numIndices, GL_UNSIGNED_SHORT, &indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawElements");

	// Read all attachment points.
	for (int ndx = 0; ndx < numAttachments; ndx++)
	{
		const glu::TransferFormat		transferFmt			= glu::getTransferFormat(attachments[ndx].readFormat);
		void*							dst					= &attachments[ndx].renderedData[0];
		const int						attachmentW			= m_fboSpec[ndx].width;
		const int						attachmentH			= m_fboSpec[ndx].height;
		const int						numValidChannels	= attachments[ndx].numWrittenChannels;
		const tcu::PixelBufferAccess	rendered			(attachments[ndx].readFormat, attachmentW, attachmentH, 1, deAlign32(attachments[ndx].readFormat.getPixelSize()*attachmentW, readAlignment), 0, &attachments[ndx].renderedData[0]);

		gl.readBuffer(GL_COLOR_ATTACHMENT0+ndx);
		gl.readPixels(0, 0, minBufSize.x(), minBufSize.y(), transferFmt.format, transferFmt.dataType, dst);

		clearUndefined(rendered, numValidChannels);
	}

	// Render reference images.
	{
		int curInNdx = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output			= m_outputs[outputNdx];
			const bool				isArray			= output.arrayLength > 0;
			const bool				isFloat			= glu::isDataTypeFloatOrVec(output.type);
			const bool				isInt			= glu::isDataTypeIntOrIVec(output.type);
			const bool				isUint			= glu::isDataTypeUintOrUVec(output.type);
			const int				scalarSize		= glu::getDataTypeScalarSize(output.type);
			const int				numVecs			= isArray ? output.arrayLength : 1;

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				const int		location	= output.location+vecNdx;
				const void*		inputData	= &inputs[curInNdx][0];

				DE_ASSERT(de::inBounds(location, 0, (int)m_fboSpec.size()));

				const int						bufW			= m_fboSpec[location].width;
				const int						bufH			= m_fboSpec[location].height;
				const tcu::PixelBufferAccess	buf				(attachments[location].referenceFormat, bufW, bufH, 1, &attachments[location].referenceData[0]);
				const tcu::PixelBufferAccess	viewportBuf		= getSubregion(buf, 0, 0, 0, viewportW, viewportH, 1);

				if (isInt || isUint)
					renderIntReference(viewportBuf, gridWidth, gridHeight, scalarSize, (const int*)inputData);
				else if (isFloat)
					renderFloatReference(viewportBuf, gridWidth, gridHeight, scalarSize, (const float*)inputData);
				else
					DE_ASSERT(false);

				curInNdx += 1;
			}
		}
	}

	// Compare all images.
	bool allLevelsOk = true;
	for (int attachNdx = 0; attachNdx < numAttachments; attachNdx++)
	{
		const int						attachmentW			= m_fboSpec[attachNdx].width;
		const int						attachmentH			= m_fboSpec[attachNdx].height;
		const int						numValidChannels	= attachments[attachNdx].numWrittenChannels;
		const tcu::BVec4				cmpMask				(numValidChannels >= 1, numValidChannels >= 2, numValidChannels >= 3, numValidChannels >= 4);
		const glu::Precision			outPrecision		= attachments[attachNdx].outPrecision;
		const tcu::TextureFormat&		format				= attachments[attachNdx].format;
		tcu::ConstPixelBufferAccess		rendered			(attachments[attachNdx].readFormat, attachmentW, attachmentH, 1, deAlign32(attachments[attachNdx].readFormat.getPixelSize()*attachmentW, readAlignment), 0, &attachments[attachNdx].renderedData[0]);
		tcu::ConstPixelBufferAccess		reference			(attachments[attachNdx].referenceFormat, attachmentW, attachmentH, 1, &attachments[attachNdx].referenceData[0]);
		tcu::TextureChannelClass		texClass			= tcu::getTextureChannelClass(format.type);
		bool							isOk				= true;
		const string					name				= string("Attachment") + de::toString(attachNdx);
		const string					desc				= string("Color attachment ") + de::toString(attachNdx);

		log << TestLog::Message << "Attachment " << attachNdx << ": " << numValidChannels << " channels have defined values and used for comparison" << TestLog::EndMessage;

		switch (texClass)
		{
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			{
				const deUint32	interpThreshold		= 4;	//!< 4 ULP interpolation threshold (interpolation always in highp)
				deUint32		outTypeThreshold	= 0;	//!< Threshold based on output type
				UVec4			formatThreshold;			//!< Threshold computed based on format.
				UVec4			finalThreshold;

				// 1 ULP rounding error is allowed for smaller floating-point formats
				switch (format.type)
				{
					case tcu::TextureFormat::FLOAT:							formatThreshold = UVec4(0);											break;
					case tcu::TextureFormat::HALF_FLOAT:					formatThreshold = UVec4((1<<(23-10)));								break;
					case tcu::TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	formatThreshold = UVec4((1<<(23-6)), (1<<(23-6)), (1<<(23-5)), 0);	break;
					default:
						DE_ASSERT(false);
						break;
				}

				// 1 ULP rounding error for highp -> output precision cast
				switch (outPrecision)
				{
					case glu::PRECISION_LOWP:		outTypeThreshold	= (1<<(23-8));	break;
					case glu::PRECISION_MEDIUMP:	outTypeThreshold	= (1<<(23-10));	break;
					case glu::PRECISION_HIGHP:		outTypeThreshold	= 0;			break;
					default:
						DE_ASSERT(false);
				}

				finalThreshold = select(max(formatThreshold, UVec4(deMax32(interpThreshold, outTypeThreshold))), UVec4(~0u), cmpMask);

				isOk = tcu::floatUlpThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, finalThreshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			{
				// \note glReadPixels() allows only 8 bits to be read. This means that RGB10_A2 will loose some
				// bits in the process and it must be taken into account when computing threshold.
				const IVec4		bits			= min(IVec4(8), tcu::getTextureFormatBitDepth(format));
				const Vec4		baseThreshold	= 1.0f / ((IVec4(1) << bits)-1).asFloat();
				const Vec4		threshold		= select(baseThreshold, Vec4(2.0f), cmpMask);

				isOk = tcu::floatThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			{
				const tcu::UVec4 threshold = select(UVec4(0u), UVec4(~0u), cmpMask);
				isOk = tcu::intThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			default:
				TCU_FAIL("Unsupported comparison");
				break;
		}

		if (!isOk)
			allLevelsOk = false;
	}

	m_testCtx.setTestResult(allLevelsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							allLevelsOk ? "Pass"				: "Image comparison failed");
	return STOP;
}